

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_Ref(char *symName)

{
  char fullname [256];
  Symbol *sym;
  char *symName_local;
  
  fullname._248_8_ = sym_FindScopedSymbol(symName);
  if ((Symbol *)fullname._248_8_ == (Symbol *)0x0) {
    sym = (Symbol *)symName;
    if (*symName == '.') {
      if (labelScope == (char *)0x0) {
        fatalerror("Local label reference \'%s\' in main scope\n",symName);
      }
      fullSymbolName(&stack0xfffffffffffffee8,0x100,symName,labelScope);
      sym = (Symbol *)&stack0xfffffffffffffee8;
    }
    fullname._248_8_ = createsymbol(sym->name);
    ((Symbol *)fullname._248_8_)->type = SYM_REF;
  }
  return (Symbol *)fullname._248_8_;
}

Assistant:

struct Symbol *sym_Ref(char const *symName)
{
	struct Symbol *sym = sym_FindScopedSymbol(symName);

	if (!sym) {
		char fullname[MAXSYMLEN + 1];

		if (symName[0] == '.') {
			if (!labelScope)
				fatalerror("Local label reference '%s' in main scope\n", symName);
			fullSymbolName(fullname, sizeof(fullname), symName, labelScope);
			symName = fullname;
		}

		sym = createsymbol(symName);
		sym->type = SYM_REF;
	}

	return sym;
}